

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

int __thiscall Assimp::ColladaParser::GetAttribute(ColladaParser *this,char *pAttr)

{
  int iVar1;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  undefined4 extraout_var;
  basic_formatter *this_00;
  char *local_1d0 [3];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1b8 [376];
  string local_40;
  int local_1c;
  char *pcStack_18;
  int index;
  char *pAttr_local;
  ColladaParser *this_local;
  
  pcStack_18 = pAttr;
  pAttr_local = (char *)this;
  local_1c = TestAttribute(this,pAttr);
  if (local_1c != -1) {
    return local_1c;
  }
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (local_1b8,(char (*) [21])"Expected attribute \"");
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar2,&stack0xffffffffffffffe8);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar2,(char (*) [16])"\" for element <");
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  local_1d0[0] = (char *)CONCAT44(extraout_var,iVar1);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar2,local_1d0);
  this_00 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                      (pbVar2,(char (*) [3])0xc67f11);
  Formatter::basic_formatter::operator_cast_to_string(&local_40,this_00);
  ThrowException(this,&local_40);
}

Assistant:

int ColladaParser::GetAttribute(const char* pAttr) const
{
    int index = TestAttribute(pAttr);
    if (index != -1)
        return index;

    // attribute not found -> throw an exception
    ThrowException(format() << "Expected attribute \"" << pAttr << "\" for element <" << mReader->getNodeName() << ">.");
    return -1;
}